

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O0

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
          (RepeatedSubstringIterator *this,SuffixTreeInternalNode *N)

{
  SuffixTreeInternalNode *local_18;
  SuffixTreeInternalNode *N_local;
  RepeatedSubstringIterator *this_local;
  
  this->N = (SuffixTreeNode *)N;
  local_18 = N;
  N_local = (SuffixTreeInternalNode *)this;
  RepeatedSubstring::RepeatedSubstring(&this->RS);
  std::vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>::
  vector(&this->InternalNodesToVisit);
  this->MinLength = 2;
  if (local_18 != (SuffixTreeInternalNode *)0x0) {
    std::vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>::
    push_back(&this->InternalNodesToVisit,&local_18);
    ::wasm::SuffixTree::RepeatedSubstringIterator::advance();
  }
  return;
}

Assistant:

RepeatedSubstringIterator(SuffixTreeInternalNode* N) : N(N) {
      // Do we have a non-null node?
      if (!N) {
        return;
      }
      // Yes. At the first step, we need to visit all of N's children.
      // Note: This means that we visit N last.
      InternalNodesToVisit.push_back(N);
      advance();
    }